

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastInt32ToBuffer(int32 i,char *buffer)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  
  buffer[0xb] = '\0';
  if (i < 0) {
    if (i < -9) {
      uVar1 = -i - 10;
      buffer[10] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      pbVar3 = (byte *)(buffer + 9);
      uVar1 = uVar1 / 10 + 1;
      do {
        *pbVar3 = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
        pbVar3 = pbVar3 + -1;
        bVar4 = 9 < uVar1;
        uVar1 = uVar1 / 10;
      } while (bVar4);
    }
    else {
      buffer[10] = '0' - (char)i;
      pbVar3 = (byte *)(buffer + 9);
    }
    *pbVar3 = 0x2d;
  }
  else {
    pbVar2 = (byte *)(buffer + 0xb);
    do {
      pbVar3 = pbVar2 + -1;
      pbVar2[-1] = (char)i + (char)((uint)i / 10) * -10 | 0x30;
      bVar4 = 9 < (uint)i;
      i = (uint)i / 10;
      pbVar2 = pbVar3;
    } while (bVar4);
  }
  return (char *)pbVar3;
}

Assistant:

char *FastInt32ToBuffer(int32 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 12 bytes is enough to store -2**32, -4294967296.
  char* p = buffer + kFastInt32ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}